

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O0

void ctemplate::StringToFile(string *s,string *filename)

{
  char *pcVar1;
  FILE *__s;
  void *__ptr;
  size_t sVar2;
  size_t sVar3;
  undefined1 local_40 [8];
  utimbuf timbuf;
  time_t file_time;
  size_t r;
  FILE *fp;
  string *filename_local;
  string *s_local;
  
  pcVar1 = (char *)std::__cxx11::string::c_str();
  __s = fopen(pcVar1,"wb");
  if (__s == (FILE *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x80,"fp");
    __assert_fail("fp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_test_util.cc"
                  ,0x80,"void ctemplate::StringToFile(const string &, const string &)");
  }
  __ptr = (void *)std::__cxx11::string::data();
  sVar2 = std::__cxx11::string::length();
  sVar2 = fwrite(__ptr,1,sVar2,__s);
  sVar3 = std::__cxx11::string::length();
  if (sVar2 != sVar3) {
    printf("ASSERT FAILED, line %d: %s\n",0x82,"r == s.length()");
    sVar3 = std::__cxx11::string::length();
    if (sVar2 != sVar3) {
      __assert_fail("r == s.length()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_test_util.cc"
                    ,0x82,"void ctemplate::StringToFile(const string &, const string &)");
    }
    exit(1);
  }
  fclose(__s);
  Mutex::Lock((Mutex *)&g_time_mutex);
  timbuf.modtime = mock_time;
  mock_time = mock_time + 1;
  Mutex::Unlock((Mutex *)&g_time_mutex);
  local_40 = (undefined1  [8])timbuf.modtime;
  timbuf.actime = timbuf.modtime;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  utime(pcVar1,(utimbuf *)local_40);
  return;
}

Assistant:

void StringToFile(const string& s, const string& filename) {
  FILE* fp = fopen(filename.c_str(), "wb");
  ASSERT(fp);
  size_t r = fwrite(s.data(), 1, s.length(), fp);
  ASSERT(r == s.length());
  fclose(fp);

  g_time_mutex.Lock();
  const time_t file_time = mock_time++;
  g_time_mutex.Unlock();
  struct utimbuf timbuf = { file_time, file_time };
  utime(filename.c_str(), &timbuf);
}